

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

void storeMapping(uint32_t codepoint,uint32_t *mapping,int32_t length,UStringPrepType type,
                 UErrorCode *status)

{
  UBool UVar1;
  short sVar2;
  uint32_t uVar3;
  void *pvVar4;
  undefined8 *value;
  uint uVar5;
  int iVar6;
  short sVar7;
  short sVar8;
  short unaff_R14W;
  short sVar9;
  
  if (hashTable == (UHashtable *)0x0) {
    hashTable = uhash_open_63(hashEntry,compareEntries,(undefined1 *)0x0,status);
    uhash_setValueDeleter_63(hashTable,valueDeleter);
  }
  uVar3 = utrie_get32_63(sprepTrie,codepoint,(UBool *)0x0);
  if ((uVar3 != 0) && (uVar3 != 0xfff2)) {
    storeMapping_cold_4();
    goto LAB_0010a31f;
  }
  if (length < 1) {
LAB_0010a1c6:
    UVar1 = utrie_set32_63(sprepTrie,codepoint,0xfefc);
    if (UVar1 != '\0') {
      return;
    }
    storeMapping_cold_2();
LAB_0010a1e6:
    if (((int)(short)(codepoint - *mapping) + 0x2000U < 0x4000) &&
       (uVar5 = (codepoint - *mapping) * 0x10000 >> 0xe & 0xfffc, uVar5 < 0xfff0)) {
      UVar1 = utrie_set32_63(sprepTrie,codepoint,uVar5);
      if (UVar1 != '\0') {
        return;
      }
      storeMapping_cold_1();
    }
  }
  else {
    sVar2 = 0;
    unaff_R14W = 0;
    do {
      sVar9 = unaff_R14W - (ushort)(mapping[sVar2] < 0x10000);
      unaff_R14W = sVar9 + 2;
      sVar2 = sVar2 + 1;
    } while (sVar2 < length);
    if (unaff_R14W == 1) goto LAB_0010a1e6;
    if (sVar9 == -2) goto LAB_0010a1c6;
  }
  iVar6 = (int)unaff_R14W;
  pvVar4 = uprv_calloc_63((long)(iVar6 + 1),2);
  if (0 < length) {
    sVar9 = 0;
    sVar2 = 0;
    do {
      uVar5 = mapping[sVar2];
      if (uVar5 < 0x10000) {
        sVar8 = 1;
        sVar7 = sVar9;
      }
      else {
        sVar7 = sVar9 + 1;
        *(short *)((long)pvVar4 + (long)sVar9 * 2) = (short)(uVar5 >> 10) + -0x2840;
        uVar5 = uVar5 & 0x3ff | 0xdc00;
        sVar8 = 2;
      }
      sVar9 = sVar8 + sVar9;
      *(short *)((long)pvVar4 + (long)sVar7 * 2) = (short)uVar5;
      sVar2 = sVar2 + 1;
    } while (sVar2 < length);
  }
  value = (undefined8 *)uprv_malloc_63(0x10);
  *value = pvVar4;
  *(UStringPrepType *)((long)value + 0xc) = type;
  *(short *)(value + 1) = unaff_R14W;
  if (3 < unaff_R14W) {
    mappingDataCapacity = mappingDataCapacity + 1;
  }
  if (maxLength < iVar6) {
    maxLength = iVar6;
  }
  uhash_iput_63(hashTable,codepoint,value,status);
  mappingDataCapacity = mappingDataCapacity + iVar6;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
LAB_0010a31f:
  storeMapping_cold_3();
  return;
}

Assistant:

extern void
storeMapping(uint32_t codepoint, uint32_t* mapping,int32_t length,
             UStringPrepType type, UErrorCode* status){
    
 
    UChar* map = NULL;
    int16_t adjustedLen=0, i, j;
    uint16_t trieWord = 0;
    ValueStruct *value = NULL;
    uint32_t savedTrieWord = 0;

    /* initialize the hashtable */
    if(hashTable==NULL){
        hashTable = uhash_open(hashEntry, compareEntries, NULL, status);
        uhash_setValueDeleter(hashTable, valueDeleter);
    }
    
    /* figure out if the code point has type already stored */
    savedTrieWord= utrie_get32(sprepTrie,codepoint,NULL);
    if(savedTrieWord!=0){
        if((savedTrieWord- _SPREP_TYPE_THRESHOLD) == USPREP_PROHIBITED){
            /* turn on the first bit in trie word */
            trieWord += 0x01;
        }else{
            /* 
             * the codepoint has value something other than prohibited
             * and a mapping .. error! 
             */
            fprintf(stderr,"Type for codepoint \\U%08X already set!.\n", (int)codepoint);
            exit(U_ILLEGAL_ARGUMENT_ERROR); 
        } 
    }

    /* figure out the real length */ 
    for(i=0; i<length; i++){
        adjustedLen += U16_LENGTH(mapping[i]);
    }

    if(adjustedLen == 0){
        trieWord = (uint16_t)(_SPREP_MAX_INDEX_VALUE << 2);
        /* make sure that the value of trieWord is less than the threshold */
        if(trieWord < _SPREP_TYPE_THRESHOLD){   
            /* now set the value in the trie */
            if(!utrie_set32(sprepTrie,codepoint,trieWord)){
                fprintf(stderr,"Could not set the value for code point.\n");
                exit(U_ILLEGAL_ARGUMENT_ERROR);   
            }
            /* value is set so just return */
            return;
        }else{
            fprintf(stderr,"trieWord cannot contain value greater than threshold 0x%04X.\n",_SPREP_TYPE_THRESHOLD);
            exit(U_ILLEGAL_CHAR_FOUND);
        }
    }

    if(adjustedLen == 1){
        /* calculate the delta */
        int16_t delta = (int16_t)((int32_t)codepoint - (int16_t) mapping[0]);
        if(delta >= SPREP_DELTA_RANGE_NEGATIVE_LIMIT && delta <= SPREP_DELTA_RANGE_POSITIVE_LIMIT){

            trieWord = delta << 2;


            /* make sure that the second bit is OFF */
            if((trieWord & 0x02) != 0 ){
                fprintf(stderr,"The second bit in the trie word is not zero while storing a delta.\n");
                exit(U_INTERNAL_PROGRAM_ERROR);
            }
            /* make sure that the value of trieWord is less than the threshold */
            if(trieWord < _SPREP_TYPE_THRESHOLD){   
                /* now set the value in the trie */
                if(!utrie_set32(sprepTrie,codepoint,trieWord)){
                    fprintf(stderr,"Could not set the value for code point.\n");
                    exit(U_ILLEGAL_ARGUMENT_ERROR);   
                }
                /* value is set so just return */
                return;
            }
        }
        /* 
         * if the delta is not in the given range or if the trieWord is larger than the threshold
         * just fall through for storing the mapping in the mapping table
         */
    }

    map = (UChar*) uprv_calloc(adjustedLen + 1, U_SIZEOF_UCHAR);
    
    for (i=0, j=0; i<length; i++) {
        U16_APPEND_UNSAFE(map, j, mapping[i]);
    }
    
    value = (ValueStruct*) uprv_malloc(sizeof(ValueStruct));
    value->mapping = map;
    value->type    = type;
    value->length  = adjustedLen;
    if(value->length > _SPREP_MAX_INDEX_TOP_LENGTH){
        mappingDataCapacity++;
    }
    if(maxLength < value->length){
        maxLength = value->length;
    }
    uhash_iput(hashTable,codepoint,value,status);
    mappingDataCapacity += adjustedLen;

    if(U_FAILURE(*status)){
        fprintf(stderr, "Failed to put entries into the hastable. Error: %s\n", u_errorName(*status));
        exit(*status);
    }
}